

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O0

FMStructDescList REVPlookup_format_structs(CManager_conflict cm,char *format_name)

{
  size_t sVar1;
  void *__ptr;
  undefined8 uVar2;
  FMStructDescList p_Var3;
  char *in_RSI;
  long in_RDI;
  char tmp [3];
  int x;
  uchar *id;
  int i;
  int slen;
  FMFormat format;
  undefined1 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd1;
  undefined1 in_stack_ffffffffffffffd2;
  undefined1 in_stack_ffffffffffffffd3;
  undefined4 in_stack_ffffffffffffffd4;
  int local_20;
  
  sVar1 = strlen(in_RSI);
  __ptr = INT_CMmalloc(CONCAT44(in_stack_ffffffffffffffd4,
                                CONCAT13(in_stack_ffffffffffffffd3,
                                         CONCAT12(in_stack_ffffffffffffffd2,
                                                  CONCAT11(in_stack_ffffffffffffffd1,
                                                           in_stack_ffffffffffffffd0)))));
  local_20 = 0;
  while( true ) {
    if ((int)sVar1 / 2 <= local_20) break;
    memset(&stack0xffffffffffffffd1,0,3);
    __isoc99_sscanf(&stack0xffffffffffffffd1,"%x",&stack0xffffffffffffffd4);
    *(char *)((long)__ptr + (long)local_20) = (char)in_stack_ffffffffffffffd4;
    local_20 = local_20 + 1;
  }
  uVar2 = FMformat_from_ID(*(undefined8 *)(*(long *)(in_RDI + 0x118) + 0x48),__ptr,
                           (long)(int)sVar1 % 2 & 0xffffffff);
  free(__ptr);
  p_Var3 = (FMStructDescList)format_list_of_FMFormat(uVar2);
  return p_Var3;
}

Assistant:

extern FMStructDescList
REVPlookup_format_structs(CManager cm, char *format_name)
{
    FMFormat format;
    int slen = (int)strlen(format_name);
    int i;
    unsigned char *id = malloc(slen/2);
    for (i=0; i < slen/2; i++) {
        int x;
        char tmp[3] = {0, 0, 0};
        tmp[0] = format_name[2*i];
        tmp[1] = format_name[2*i + 1];
        sscanf(tmp, "%x", &x);
        id[i] = (unsigned char) x;
    }
    format = FMformat_from_ID(cm->evp->fmc, (char*)id);
    free(id);
    return format_list_of_FMFormat(format);
}